

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D2xNvmFlash.cpp
# Opt level: O0

void __thiscall D2xNvmFlash::writePage(D2xNvmFlash *this,uint32_t page)

{
  uint32_t uVar1;
  FlashPageError *this_00;
  uint32_t local_44;
  uint32_t addr;
  uint32_t page_local;
  D2xNvmFlash *this_local;
  
  if ((this->super_Flash)._pages <= page) {
    this_00 = (FlashPageError *)__cxa_allocate_exception(8);
    FlashPageError::FlashPageError(this_00);
    __cxa_throw(this_00,&FlashPageError::typeinfo,FlashPageError::~FlashPageError);
  }
  uVar1 = readReg(this,'\x04');
  writeReg(this,'\x04',uVar1 | 0x40080);
  if ((((this->super_Flash).field_0xf4 & 1) != 0) && ((page & 3) == 0)) {
    erase(this,page * (this->super_Flash)._size,(this->super_Flash)._size << 2);
  }
  command(this,'D');
  uVar1 = (this->super_Flash)._addr + page * (this->super_Flash)._size;
  WordCopyApplet::setDstAddr(&(this->super_Flash)._wordCopy,uVar1);
  if (((this->super_Flash)._onBufferA & 1U) == 0) {
    local_44 = (this->super_Flash)._pageBufferB;
  }
  else {
    local_44 = (this->super_Flash)._pageBufferA;
  }
  WordCopyApplet::setSrcAddr(&(this->super_Flash)._wordCopy,local_44);
  (this->super_Flash)._onBufferA = (bool)(((this->super_Flash)._onBufferA ^ 0xffU) & 1);
  waitReady(this);
  Applet::runv(&(this->super_Flash)._wordCopy.super_Applet);
  writeReg(this,'\x1c',uVar1 >> 1);
  command(this,'\x04');
  return;
}

Assistant:

void
D2xNvmFlash::writePage(uint32_t page)
{
    if (page >= _pages)
    {
        throw FlashPageError();
    }

    // Disable cache and configure manual page write
    writeReg(NVM_REG_CTRLB, readReg(NVM_REG_CTRLB) | (0x1 << 18) | (0x1 << 7));

    // Auto-erase if writing at the start of the erase page
    if (_eraseAuto && page % ERASE_ROW_PAGES == 0)
        erase(page * _size, ERASE_ROW_PAGES * _size);

    // Clear page buffer
    command(NVM_CMD_PBC);

    // Compute the start address.
    uint32_t addr = _addr + (page * _size);

    _wordCopy.setDstAddr(addr);
    _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
    _onBufferA = !_onBufferA;
    waitReady();
    _wordCopy.runv();

    writeReg(NVM_REG_ADDR, addr / 2);
    command(NVM_CMD_WP);
}